

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgenericshape.cpp
# Opt level: O1

TPZTransform<double> *
GetSideTransform<pzshape::TPZShapePoint>
          (TPZTransform<double> *__return_storage_ptr__,int side,int trans_id)

{
  TPZFNMatrix<3,_double> *this;
  MElementType MVar1;
  TPZTransform<double> *t;
  TPZTransform<double> TransParametric;
  undefined1 local_400 [48];
  double *local_3d0;
  TPZVec<int> local_3c8;
  int local_3a8 [6];
  undefined **local_390;
  double *local_388;
  _func_int **pp_Stack_380;
  double *local_378;
  TPZFMatrix<double> local_260;
  TPZTransform<double> local_1d0;
  
  MVar1 = pztopology::TPZPoint::Type(side);
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,0,0);
  TPZTransform<double>::TPZTransform(&local_1d0,1,1);
  if (MVar1 == EOned) {
    pzshape::TPZShapeLinear::ParametricTransform((TPZTransform<double> *)local_400,trans_id);
    TPZTransform<double>::operator=(&local_1d0,(TPZTransform<double> *)local_400);
  }
  else if (MVar1 == ETriangle) {
    pzshape::TPZShapeTriang::ParametricTransform((TPZTransform<double> *)local_400,trans_id);
    TPZTransform<double>::operator=(&local_1d0,(TPZTransform<double> *)local_400);
  }
  else {
    if (MVar1 != EQuadrilateral) goto LAB_00fcaffd;
    pzshape::TPZShapeQuad::ParametricTransform((TPZTransform<double> *)local_400,trans_id);
    TPZTransform<double>::operator=(&local_1d0,(TPZTransform<double> *)local_400);
  }
  TPZTransform<double>::~TPZTransform((TPZTransform<double> *)local_400);
LAB_00fcaffd:
  local_400._8_8_ = 0;
  local_400._16_8_ = (_func_int **)0x0;
  local_400[0x18] = '\0';
  local_400[0x19] = '\0';
  local_400._0_8_ = &PTR__TPZFMatrix_0183c898;
  local_400._32_8_ = (double *)0x0;
  local_400._40_8_ = (double *)0x0;
  local_3d0 = (double *)0x0;
  TPZVec<int>::TPZVec(&local_3c8,0);
  local_3c8.fStore = local_3a8;
  local_3c8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_3c8.fNElements = 0;
  local_3c8.fNAlloc = 0;
  local_390 = &PTR__TPZVec_0183b4b0;
  local_388 = (double *)0x0;
  pp_Stack_380 = (_func_int **)0x0;
  local_378 = (double *)0x0;
  (*local_1d0.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0x25])
            (&local_1d0.fMult,&__return_storage_ptr__->fMult,local_400,0);
  TPZFMatrix<double>::operator=
            (&(__return_storage_ptr__->fMult).super_TPZFMatrix<double>,
             (TPZFMatrix<double> *)local_400);
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_260.fElem = (double *)0x0;
  local_260.fGiven = (double *)0x0;
  local_260.fSize = 0;
  TPZVec<int>::TPZVec(&local_260.fPivot.super_TPZVec<int>,0);
  local_260.fPivot.super_TPZVec<int>.fStore = local_260.fPivot.fExtAlloc;
  local_260.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_260.fPivot.super_TPZVec<int>.fNElements = 0;
  local_260.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_260.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_260.fWork.fStore = (double *)0x0;
  local_260.fWork.fNElements = 0;
  local_260.fWork.fNAlloc = 0;
  this = &__return_storage_ptr__->fSum;
  (*local_1d0.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0x25])(&local_1d0.fMult,this,&local_260,0);
  TPZFMatrix<double>::operator=(&this->super_TPZFMatrix<double>,&local_260);
  TPZFMatrix<double>::operator+=
            (&this->super_TPZFMatrix<double>,(TPZMatrix<double> *)&local_1d0.fSum);
  TPZFMatrix<double>::~TPZFMatrix(&local_260);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_400);
  TPZTransform<double>::~TPZTransform(&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<REAL> GetSideTransform(const int side, int trans_id) {
    
    MElementType type_side = TSHAPE::Type(side);
    TPZTransform<REAL> TransElToSide = TSHAPE::TransformElementToSide(side);
    
    TPZTransform<REAL> TransParametric(1,1);
    switch (type_side) {
        case EOned:
        {
            TransParametric = pzshape::TPZShapeLinear::ParametricTransform(trans_id);
        }
            break;
        case EQuadrilateral:
        {
            TransParametric = pzshape::TPZShapeQuad::ParametricTransform(trans_id);
        }
            break;
        case ETriangle:
        {
            TransParametric = pzshape::TPZShapeTriang::ParametricTransform(trans_id);
        }
            break;
        default:
            break;
    }
    //why TSHAPE::Dimension>2 here??
    if ((side == TSHAPE::NSides - 1) && TSHAPE::Dimension>2) {
        
        return TransElToSide;
    }
    else{
        TPZFMatrix<REAL> resul_mult;
        TransParametric.Mult().Multiply(TransElToSide.Mult(), resul_mult);
        TransElToSide.Mult() = resul_mult;
        TPZFMatrix<REAL> res1;
        TransParametric.Mult().Multiply( TransElToSide.Sum(), res1);
        TransElToSide.Sum() =res1;
        TransElToSide.Sum() += TransParametric.Sum();
        
    }
    
    return TransElToSide;
    
}